

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall ANN::ANN(ANN *this,initializer_list<unsigned_int> *n_perceptrons)

{
  uint *puVar1;
  uint *puVar2;
  Layer layer;
  Layer local_88;
  
  this->learning_rate = 0.01;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->m_dataSet = (DataSet *)0x0;
  this->m_batchSize = 1;
  this->m_lr = 0.01;
  puVar1 = n_perceptrons->_M_array;
  this->m_n_input = *puVar1;
  this->m_n_output = puVar1[n_perceptrons->_M_len - 1];
  this->m_batchSize = 1;
  if (puVar1 != n_perceptrons->_M_array + n_perceptrons->_M_len) {
    do {
      puVar2 = puVar1 + 1;
      local_88.m_biases.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_biases.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.m_biases.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.m_weights.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.m_weights.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.m_weights.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Layer::add_perceptron(&local_88,*puVar1);
      if (puVar2 != n_perceptrons->_M_array + n_perceptrons->_M_len) {
        Matrix::set_shape(&local_88.m_weights,*puVar2,*puVar1);
        Matrix::random_init(&local_88.m_weights,-1.0,1.0);
        Matrix::set_shape(&local_88.m_biases,1,*puVar2);
        Matrix::random_init(&local_88.m_biases,-1.0,1.0);
      }
      std::vector<Layer,_std::allocator<Layer>_>::push_back(&this->m_layers,&local_88);
      Layer::~Layer(&local_88);
      puVar1 = puVar2;
    } while (puVar2 != n_perceptrons->_M_array + n_perceptrons->_M_len);
  }
  return;
}

Assistant:

ANN::ANN(const std::initializer_list<uint>& n_perceptrons){
    auto it=n_perceptrons.begin();
    m_n_input=*n_perceptrons.begin();
    m_n_output=*(n_perceptrons.end()-1);
    m_batchSize=1;
    for(auto it=n_perceptrons.begin();it!=n_perceptrons.end();++it){
        Layer layer;
        layer.add_perceptron(*it);
        if(it+1!=n_perceptrons.end()){
            layer.weights().set_shape(*(it+1), *it);
            layer.weights().random_init(-1., 1.);
            layer.biases().set_shape(1, *(it+1));
            layer.biases().random_init(-1., 1.);
        }
        m_layers.push_back(layer);
    }
}